

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O0

type __thiscall
llvm::yaml::
yamlize<std::vector<llvm::DWARFYAML::PubEntry,std::allocator<llvm::DWARFYAML::PubEntry>>,llvm::yaml::EmptyContext>
          (yaml *this,IO *io,
          vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_> *Seq,
          bool param_3,EmptyContext *Ctx)

{
  vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_> *this_00;
  ulong uVar1;
  size_t sVar2;
  type *io_00;
  undefined7 in_register_00000009;
  uint local_48;
  undefined8 local_40;
  void *SaveInfo;
  uint local_30;
  uint i;
  uint count;
  uint incnt;
  EmptyContext *Ctx_local;
  IO *pIStack_18;
  bool param_2_local;
  vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_> *Seq_local;
  IO *io_local;
  
  _count = CONCAT71(in_register_00000009,param_3);
  Ctx_local._7_1_ = (byte)Seq & 1;
  pIStack_18 = io;
  Seq_local = (vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_> *)this;
  i = (**(code **)(*(long *)this + 0x18))();
  uVar1 = (*(code *)(((Seq_local->
                      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                      )._M_impl.super__Vector_impl_data._M_start)->Name).Length)();
  if ((uVar1 & 1) == 0) {
    local_48 = i;
  }
  else {
    sVar2 = SequenceTraitsImpl<std::vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>,_false>
            ::size((IO *)Seq_local,
                   (vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_> *)
                   pIStack_18);
    local_48 = (uint)sVar2;
  }
  local_30 = local_48;
  for (SaveInfo._4_4_ = 0; SaveInfo._4_4_ < local_30; SaveInfo._4_4_ = SaveInfo._4_4_ + 1) {
    uVar1 = (*(code *)(Seq_local->
                      super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                      )._M_impl.super__Vector_impl_data._M_start[1].Name.Data)
                      (Seq_local,SaveInfo._4_4_,&local_40);
    this_00 = Seq_local;
    if ((uVar1 & 1) != 0) {
      io_00 = SequenceTraitsImpl<std::vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>,_false>
              ::element((IO *)Seq_local,
                        (vector<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                         *)pIStack_18,(ulong)SaveInfo._4_4_);
      yamlize<llvm::DWARFYAML::PubEntry,llvm::yaml::EmptyContext>
                ((yaml *)this_00,(IO *)io_00,(PubEntry *)0x1,SUB81(_count,0),Ctx);
      (*(code *)(Seq_local->
                super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                )._M_impl.super__Vector_impl_data._M_start[1].Name.Length)(Seq_local,local_40);
    }
  }
  (**(code **)((Seq_local->
               super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
               )._M_impl.super__Vector_impl_data._M_start + 2))();
  return;
}

Assistant:

typename std::enable_if<has_SequenceTraits<T>::value, void>::type
yamlize(IO &io, T &Seq, bool, Context &Ctx) {
  if ( has_FlowTraits< SequenceTraits<T>>::value ) {
    unsigned incnt = io.beginFlowSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightFlowElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightFlowElement(SaveInfo);
      }
    }
    io.endFlowSequence();
  }
  else {
    unsigned incnt = io.beginSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightElement(SaveInfo);
      }
    }
    io.endSequence();
  }
}